

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

ON_SimpleArray<ON_2dPoint> *
ON_LiftToCover(ON_SimpleArray<ON_2dPoint> *__return_storage_ptr__,ON_SimpleArray<ON_2dPoint> *in,
              ON_Interval *dom,bool *closed,double normband)

{
  int i;
  long lVar1;
  long lVar2;
  ON_2dPoint Pin;
  ON_2dPoint local_88;
  ON_PeriodicDomain Cover;
  
  ON_PeriodicDomain::ON_PeriodicDomain(&Cover,dom,closed,normband);
  ON_SimpleArray<ON_2dPoint>::ON_SimpleArray(__return_storage_ptr__,(long)in->m_count);
  lVar2 = 8;
  for (lVar1 = 0; lVar1 < in->m_count; lVar1 = lVar1 + 1) {
    Pin.y = *(double *)((long)&in->m_a->x + lVar2);
    Pin.x = *(double *)((long)in->m_a + lVar2 + -8);
    local_88 = ON_PeriodicDomain::LiftToCover(&Cover,Pin,false);
    ON_SimpleArray<ON_2dPoint>::Append(__return_storage_ptr__,&local_88);
    lVar2 = lVar2 + 0x10;
  }
  return __return_storage_ptr__;
}

Assistant:

ON_SimpleArray<ON_2dPoint> ON_LiftToCover(
	const ON_SimpleArray<ON_2dPoint>& in,
	const ON_Interval dom[2], bool closed[2],
	double normband)
{
	ON_PeriodicDomain Cover(dom, closed, normband);
	ON_SimpleArray<ON_2dPoint> out(in.Count());
	for (int i = 0; i < in.Count(); i++)
		out.Append(Cover.LiftToCover(in[i]));

	return out;
}